

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void arm11mpcore_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  *(uint *)(obj[1].tb_jmp_cache + 0x5f3) = *(uint *)(obj[1].tb_jmp_cache + 0x5f3) | 0x1120010;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fb022;
  obj[1].tb_jmp_cache[0x647] = (TranslationBlock *)0x1d192992410120b4;
  obj[1].tb_jmp_cache[0x63a] = (TranslationBlock *)0x11111111;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x100000111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 2;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x1002030201100103;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1222000;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x1200211100100011;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x110213111221011;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x141;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x662) = 1;
  return;
}

Assistant:

static void arm11mpcore_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V6K);
    set_feature(&cpu->env, ARM_FEATURE_VAPA);
    set_feature(&cpu->env, ARM_FEATURE_MPIDR);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    cpu->midr = 0x410fb022;
    cpu->reset_fpsid = 0x410120b4;
    cpu->isar.mvfr0 = 0x11111111;
    cpu->isar.mvfr1 = 0x00000000;
    cpu->ctr = 0x1d192992; /* 32K icache 32K dcache */
    cpu->id_pfr0 = 0x111;
    cpu->id_pfr1 = 0x1;
    cpu->isar.id_dfr0 = 0;
    cpu->id_afr0 = 0x2;
    cpu->isar.id_mmfr0 = 0x01100103;
    cpu->isar.id_mmfr1 = 0x10020302;
    cpu->isar.id_mmfr2 = 0x01222000;
    cpu->isar.id_isar0 = 0x00100011;
    cpu->isar.id_isar1 = 0x12002111;
    cpu->isar.id_isar2 = 0x11221011;
    cpu->isar.id_isar3 = 0x01102131;
    cpu->isar.id_isar4 = 0x141;
    cpu->reset_auxcr = 1;
}